

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * lws_create_new_server_wsi(lws_vhost *vhost,int fixed_tsi,char *desc)

{
  lws_context *context;
  lws_context *plVar1;
  int iVar2;
  int iVar3;
  lws_log_cx *plVar4;
  bool local_35;
  int local_34;
  int n;
  lws *new_wsi;
  char *desc_local;
  int fixed_tsi_local;
  lws_vhost *vhost_local;
  
  local_34 = fixed_tsi;
  if (fixed_tsi < 0) {
    local_34 = lws_get_idlest_tsi(vhost->context);
  }
  if (local_34 < 0) {
    plVar4 = lwsl_vhost_get_cx(vhost);
    _lws_log_cx(plVar4,lws_log_prepend_vhost,vhost,1,"lws_create_new_server_wsi",
                "no space for new conn");
    vhost_local = (lws_vhost *)0x0;
  }
  else {
    vhost_local = (lws_vhost *)
                  __lws_wsi_create_with_role
                            (vhost->context,local_34,(lws_role_ops *)0x0,(vhost->lc).log_cx);
    if ((lws *)vhost_local == (lws *)0x0) {
      plVar4 = lwsl_vhost_get_cx(vhost);
      _lws_log_cx(plVar4,lws_log_prepend_vhost,vhost,1,"lws_create_new_server_wsi","OOM");
      vhost_local = (lws_vhost *)0x0;
    }
    else {
      context = vhost->context;
      plVar1 = vhost->context;
      iVar2 = strcmp(desc,"adopted");
      iVar3 = 2;
      if (iVar2 != 0) {
        iVar3 = 3;
      }
      __lws_lc_tag(context,plVar1->lcg + iVar3,&((lws *)vhost_local)->lc,desc);
      ((lws *)vhost_local)->wsistate = ((lws *)vhost_local)->wsistate | 0x20000000;
      ((lws *)vhost_local)->tsi = (char)local_34;
      plVar4 = lwsl_wsi_get_cx((lws *)vhost_local);
      _lws_log_cx(plVar4,lws_log_prepend_wsi,vhost_local,0x10,"lws_create_new_server_wsi",
                  "joining vh %s, tsi %d",vhost->name,(int)((lws *)vhost_local)->tsi);
      lws_vhost_bind_wsi(vhost,(lws *)vhost_local);
      *(ulong *)&((lws *)vhost_local)->field_0x46e =
           *(ulong *)&((lws *)vhost_local)->field_0x46e & 0xffffffffffff9fff | 0x2000;
      ((lws *)vhost_local)->retry_policy = vhost->retry_policy;
      lwsi_set_state((lws *)vhost_local,0x200);
      *(ulong *)&((lws *)vhost_local)->field_0x46e =
           *(ulong *)&((lws *)vhost_local)->field_0x46e & 0xfffffffffffffffe;
      local_35 = false;
      if (vhost != (lws_vhost *)0x0) {
        local_35 = (vhost->tls).use_ssl != 0;
      }
      (((lws *)vhost_local)->tls).use_ssl = (uint)local_35;
      (((lws *)vhost_local)->a).protocol = vhost->protocols;
      ((lws *)vhost_local)->user_space = (void *)0x0;
      (*vhost->protocols->callback)
                ((lws *)vhost_local,LWS_CALLBACK_WSI_CREATE,(void *)0x0,(void *)0x0,0);
    }
  }
  return (lws *)vhost_local;
}

Assistant:

struct lws *
lws_create_new_server_wsi(struct lws_vhost *vhost, int fixed_tsi, const char *desc)
{
	struct lws *new_wsi;
	int n = fixed_tsi;

	if (n < 0)
		n = lws_get_idlest_tsi(vhost->context);

	if (n < 0) {
		lwsl_vhost_err(vhost, "no space for new conn");
		return NULL;
	}

	lws_context_lock(vhost->context, __func__);
	new_wsi = __lws_wsi_create_with_role(vhost->context, n, NULL,
					     vhost->lc.log_cx);
	lws_context_unlock(vhost->context);
	if (new_wsi == NULL) {
		lwsl_vhost_err(vhost, "OOM");
		return NULL;
	}

	lws_wsi_fault_timedclose(new_wsi);

	__lws_lc_tag(vhost->context, &vhost->context->lcg[
#if defined(LWS_ROLE_H2) || defined(LWS_ROLE_MQTT)
	strcmp(desc, "adopted") ? LWSLCG_WSI_MUX :
#endif
	LWSLCG_WSI_SERVER], &new_wsi->lc, desc);

	new_wsi->wsistate |= LWSIFR_SERVER;
	new_wsi->tsi = (char)n;
	lwsl_wsi_debug(new_wsi, "joining vh %s, tsi %d",
			vhost->name, new_wsi->tsi);

	lws_vhost_bind_wsi(vhost, new_wsi);
	new_wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;
	new_wsi->retry_policy = vhost->retry_policy;

	/* initialize the instance struct */

	lwsi_set_state(new_wsi, LRS_UNCONNECTED);
	new_wsi->hdr_parsing_completed = 0;

#ifdef LWS_WITH_TLS
	new_wsi->tls.use_ssl = LWS_SSL_ENABLED(vhost);
#endif

	/*
	 * these can only be set once the protocol is known
	 * we set an un-established connection's protocol pointer
	 * to the start of the supported list, so it can look
	 * for matching ones during the handshake
	 */
	new_wsi->a.protocol = vhost->protocols;
	new_wsi->user_space = NULL;

	/*
	 * outermost create notification for wsi
	 * no user_space because no protocol selection
	 */
	vhost->protocols[0].callback(new_wsi, LWS_CALLBACK_WSI_CREATE, NULL,
				     NULL, 0);

	return new_wsi;
}